

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O0

int gen_union_fields(fb_output_t *out,char *st,int n,char *s,fb_compound_type_t *ct,int is_vector)

{
  short sVar1;
  char *pcVar2;
  char *kind;
  fb_scoped_name_t snu;
  fb_scoped_name_t snref;
  char *pcStack_70;
  int nu;
  char *su;
  fb_member_t *member;
  fb_symbol_t *sym;
  char *nsc;
  fb_compound_type_t *pfStack_48;
  int is_vector_local;
  fb_compound_type_t *ct_local;
  char *s_local;
  char *pcStack_30;
  int n_local;
  char *st_local;
  fb_output_t *out_local;
  
  pcVar2 = "value";
  if (is_vector != 0) {
    pcVar2 = "vector_value";
  }
  sym = (fb_symbol_t *)out;
  nsc._4_4_ = is_vector;
  pfStack_48 = ct;
  ct_local = (fb_compound_type_t *)s;
  s_local._4_4_ = n;
  pcStack_30 = st;
  st_local = out->nsc;
  memset(&snu.total_len,0,0xe8);
  memset(&kind,0,0xe8);
  fb_compound_name(pfStack_48,(fb_scoped_name_t *)&snu.total_len);
  member = (fb_member_t *)pfStack_48->members;
  do {
    if (member == (fb_member_t *)0x0) {
      return 0;
    }
    su = (char *)member;
    symbol_name(&member->symbol,(int *)&snref.field_0xe4,&stack0xffffffffffffff90);
    sVar1 = *(short *)(su + 0x28);
    if (sVar1 != 0) {
      if (sVar1 == 0xb) {
        fprintf(*(FILE **)(st_local + 0xd0),
                "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n",sym,pcVar2,sym,pcStack_30
                ,s_local._4_4_,ct_local,&snu.total_len,snref._228_4_,pcStack_70);
      }
      else {
        if (sVar1 != 0xf) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                  ,0x630,"internal error: unexpected union member type");
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                        ,0x630,
                        "int gen_union_fields(fb_output_t *, const char *, int, const char *, fb_compound_type_t *, int)"
                       );
        }
        fb_compound_name(*(fb_compound_type_t **)(su + 0x18),(fb_scoped_name_t *)&kind);
        if (*(short *)(*(long *)(su + 0x18) + 0x10) == 0) {
          fprintf(*(FILE **)(st_local + 0xd0),
                  "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",sym,pcVar2,sym,
                  pcStack_30,s_local._4_4_,ct_local,&snu.total_len,snref._228_4_,pcStack_70,&kind);
        }
        else {
          if (*(short *)(*(long *)(su + 0x18) + 0x10) != 1) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                    ,0x626,"internal error: unexpected union member compound type");
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                          ,0x626,
                          "int gen_union_fields(fb_output_t *, const char *, int, const char *, fb_compound_type_t *, int)"
                         );
          }
          fprintf(*(FILE **)(st_local + 0xd0),
                  "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",sym,pcVar2,sym,
                  pcStack_30,s_local._4_4_,ct_local,&snu.total_len,snref._228_4_,pcStack_70,&kind);
        }
      }
    }
    member = (fb_member_t *)(member->symbol).link;
  } while( true );
}

Assistant:

static int gen_union_fields(fb_output_t *out, const char *st, int n, const char *s,
        fb_compound_type_t *ct, int is_vector)
{
    const char *nsc = out->nsc;
    fb_symbol_t *sym;
    fb_member_t *member;
    const char *su;
    int nu;
    fb_scoped_name_t snref;
    fb_scoped_name_t snu;
    const char *kind = is_vector ? "vector_value" : "value";

    fb_clear(snref);
    fb_clear(snu);
    fb_compound_name(ct, &snref);
    for (sym = ct->members; sym; sym = sym->link) {
        member = (fb_member_t *)sym;
        symbol_name(sym, &nu, &su);
        switch (member->type.type) {
        case vt_missing:
            break;
        case vt_compound_type_ref:
            fb_compound_name(member->type.ct, &snu);
            switch (member->type.ct->symbol.kind) {
            case fb_is_table:
                fprintf(out->fp,
                        "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",
                        nsc, kind, nsc, st, n, s, snref.text, nu, su, snu.text);
                break;
            case fb_is_struct:
                fprintf(out->fp,
                        "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",
                        nsc, kind, nsc, st, n, s, snref.text, nu, su, snu.text);
                break;
            default:
                gen_panic(out, "internal error: unexpected union member compound type");
                return -1;
            }
            break;
        case vt_string_type:
            fprintf(out->fp,
                    "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n",
                    nsc, kind, nsc, st, n, s, snref.text, nu, su);
            break;
        default:
            gen_panic(out, "internal error: unexpected union member type");
            return -1;
        }
    }
    return 0;
}